

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O3

bool __thiscall
Kernel::MatchingUtils::
matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
          (MatchingUtils *this,Term *base,Term *instance,Binder *binder)

{
  uint uVar1;
  sockaddr *psVar2;
  sockaddr *__addr;
  uint uVar7;
  bool bVar3;
  int iVar4;
  TermList base_00;
  TermList **ppTVar5;
  TermList **ppTVar6;
  int iVar8;
  sockaddr *psVar9;
  TermList *pTVar10;
  MatchingUtils *pMVar11;
  Literal *l2;
  Literal *l1;
  
  if ((((*(ulong *)(this + 0x28) & 8) != 0) && ((base->_args[0]._content & 8) != 0)) &&
     (binder = (Binder *)(ulong)*(uint *)(this + 0x10), base->_weight < *(uint *)(this + 0x10))) {
    return false;
  }
  if (((*(ulong *)(this + 0x28) & 0x10) != 0) && (*(int *)(this + 0xc) < 0)) {
    pMVar11 = *(MatchingUtils **)(this + 0x20);
    base_00 = SortHelper::getEqualityArgumentSort((Literal *)base);
    bVar3 = matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                      (pMVar11,base_00,(TermList)instance,binder);
    if (!bVar3) {
      return false;
    }
  }
  uVar7 = *(uint *)(this + 0xc);
  uVar1 = *(uint *)&base->field_0xc;
  if ((matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder&)
       ::subterms == '\0') &&
     (iVar4 = __cxa_guard_acquire(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder&)
                                   ::subterms), iVar4 != 0)) {
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
    ::subterms._capacity = 0x20;
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
    ::subterms._stack = (TermList **)::operator_new(0x100,0x10);
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
    ::subterms._end =
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
         ::subterms._stack +
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
         ::subterms._capacity;
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
    ::subterms._cursor =
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
         ::subterms._stack;
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,
                 &matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                  ::subterms,&__dso_handle);
    __cxa_guard_release(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder&)
                         ::subterms);
  }
  pMVar11 = this + (ulong)(uVar7 & 0xfffffff) * 8 + 0x28;
  pTVar10 = base->_args + (uVar1 & 0xfffffff);
  matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
  ::subterms._cursor =
       matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
       ::subterms._stack;
  ppTVar5 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
            ::subterms._stack;
  do {
    while( true ) {
      if ((*(uint *)(pMVar11 + -8) & 3) != 2) {
        if (ppTVar5 ==
            matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
            ::subterms._end) {
          Lib::Stack<Kernel::TermList_*>::expand
                    (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                      ::subterms);
          ppTVar5 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                    ::subterms._cursor;
        }
        *ppTVar5 = (TermList *)(pTVar10 + -1);
        matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
        ::subterms._cursor =
             matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
             ::subterms._cursor + 1;
        if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
            ::subterms._cursor ==
            matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
            ::subterms._end) {
          Lib::Stack<Kernel::TermList_*>::expand
                    (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                      ::subterms);
        }
        *matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
         ::subterms._cursor = (TermList *)(pMVar11 + -8);
        ppTVar5 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                  ::subterms._cursor + 1;
        matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
        ::subterms._cursor = ppTVar5;
      }
      psVar2 = *(sockaddr **)pMVar11;
      uVar7 = (uint)psVar2 & 3;
      ppTVar6 = ppTVar5;
      if (uVar7 != 3) break;
      *(uint64_t *)(instance->_vptr_Term[6] + ((ulong)psVar2 & 0x3fffffffc) * 2) = pTVar10->_content
      ;
LAB_00349257:
      if (ppTVar6 ==
          matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
          ::subterms._stack) {
        return true;
      }
      pMVar11 = (MatchingUtils *)ppTVar6[-1];
      ppTVar5 = ppTVar6 + -2;
      pTVar10 = ppTVar6[-2];
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
      ::subterms._cursor = ppTVar5;
    }
    __addr = (sockaddr *)pTVar10->_content;
    if (((uint)__addr & 3) == 3) {
      *(sockaddr **)(instance->_vptr_Term[6] + ((ulong)__addr & 0x3fffffffc) * 2) = psVar2;
      goto LAB_00349257;
    }
    if (((ulong)psVar2 & 3) != 0) {
      iVar4 = Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher
              ::Binder::bind((Binder *)instance,(int)((ulong)psVar2 >> 2),__addr,uVar7);
      ppTVar6 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                ::subterms._cursor;
      if ((char)iVar4 == '\0') {
        return false;
      }
      goto LAB_00349257;
    }
    if (((ulong)__addr & 3) != 0) {
      return false;
    }
    if (*(int *)(psVar2->sa_data + 6) != *(int *)(__addr->sa_data + 6)) {
      return false;
    }
    if (((psVar2[2].sa_data[6] & 8U) != 0) && ((__addr[2].sa_data[6] & 8U) != 0)) {
      psVar9 = psVar2;
      if (*(int *)(psVar2->sa_data + 10) < 0) {
        iVar4 = 0;
        do {
          psVar9 = *(sockaddr **)(psVar9 + 2);
          if (((ulong)psVar9 & 1) != 0) {
            iVar8 = 3;
            goto LAB_003492cf;
          }
          iVar4 = iVar4 + 2;
        } while (*(int *)(psVar9->sa_data + 10) < 0);
      }
      else {
        iVar4 = 0;
      }
      iVar8._0_2_ = psVar9[2].sa_family;
      iVar8._2_1_ = psVar9[2].sa_data[0];
      iVar8._3_1_ = psVar9[2].sa_data[1];
LAB_003492cf:
      if ((psVar2 != __addr) && (iVar8 == -iVar4)) {
        return false;
      }
      uVar1._0_2_ = psVar2[1].sa_family;
      uVar1._2_1_ = psVar2[1].sa_data[0];
      uVar1._3_1_ = psVar2[1].sa_data[1];
      uVar7._0_2_ = __addr[1].sa_family;
      uVar7._2_1_ = __addr[1].sa_data[0];
      uVar7._3_1_ = __addr[1].sa_data[1];
      if (uVar7 < uVar1) {
        return false;
      }
    }
    if ((*(uint *)(psVar2->sa_data + 10) & 0xfffffff) == 0) goto LAB_00349257;
    pMVar11 = (MatchingUtils *)
              (psVar2[2].sa_data + ((ulong)*(uint *)(psVar2->sa_data + 10) & 0xfffffff) * 8 + 6);
    pTVar10 = (TermList *)
              (__addr[2].sa_data + (ulong)(*(uint *)(__addr->sa_data + 10) & 0xfffffff) * 8 + 6);
  } while( true );
}

Assistant:

bool MatchingUtils::matchArgs(Term* base, Term* instance, Binder& binder)
{
  ASS_EQ(base->functor(),instance->functor());
  if(base->shared() && instance->shared()) {
    if(base->weight() > instance->weight()) {
      return false;
    }
  }
  // Note: while this function only cares about the term structure,
  // for two-variable equalities we need to get the sort of the arguments from the Literal object.
  if(base->isLiteral() && static_cast<Literal*>(base)->isTwoVarEquality()){
    Literal* l1 = static_cast<Literal*>(base);
    Literal* l2 = static_cast<Literal*>(instance);
    if(!matchTerms(l1->twoVarEqSort(), SortHelper::getEqualityArgumentSort(l2), binder)){
      return false;
    }
  }
  ASS_G(base->arity(),0);

  TermList* bt=base->args();
  TermList* it=instance->args();

  static Stack<TermList*> subterms(32);
  subterms.reset();

  for (;;) {
    if (!bt->next()->isEmpty()) {
      subterms.push(it->next());
      subterms.push(bt->next());
    }
    if(bt->isSpecialVar()) {
      binder.specVar(bt->var(), *it);
    } else if(it->isSpecialVar()) {
      binder.specVar(it->var(), *bt);
    } else if(bt->isTerm()) {
      if(!it->isTerm()) {
	return false;
      }
      Term* s = bt->term();
      Term* t = it->term();
      if(s->functor()!=t->functor()) {
	return false;
      }
      if(bt->term()->shared() && it->term()->shared()) {
	if(bt->term()->ground() && *bt!=*it) {
	  return false;
	}
	if(s->weight() > t->weight()) {
	  return false;
	}
      }
      if(s->arity() > 0) {
	bt = s->args();
	it = t->args();
	continue;
      }
    } else {
      ASS(bt->isOrdinaryVar());
      if(!binder.bind(bt->var(), *it)) {
	return false;
      }
    }
    if(subterms.isEmpty()) {
      return true;
    }
    bt = subterms.pop();
    it = subterms.pop();
  }
}